

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O0

void QtMWidgets::drawArrow2(QPainter *p,QRect *r,QColor *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  QBrush local_50 [24];
  QPainterPath local_38 [8];
  QPainterPath path;
  qreal middle;
  qreal width;
  QColor *color_local;
  QRect *r_local;
  QPainter *p_local;
  
  iVar1 = QRect::height(r);
  dVar4 = (double)(iVar1 / 3);
  iVar1 = QRect::width(r);
  _path = (double)(iVar1 / 2);
  QPainterPath::QPainterPath(local_38);
  iVar1 = QRect::x(r);
  iVar2 = QRect::y(r);
  QPainterPath::moveTo(local_38,(double)iVar1,(double)iVar2);
  iVar1 = QRect::x(r);
  iVar2 = QRect::y(r);
  QPainterPath::lineTo(local_38,(double)iVar1,(double)iVar2 + dVar4);
  iVar1 = QRect::x(r);
  dVar5 = (double)iVar1 + _path;
  iVar1 = QRect::y(r);
  iVar2 = QRect::height(r);
  QPainterPath::lineTo(local_38,dVar5,(double)(iVar1 + iVar2));
  iVar1 = QRect::x(r);
  iVar2 = QRect::width(r);
  iVar3 = QRect::y(r);
  QPainterPath::lineTo(local_38,(double)(iVar1 + iVar2),(double)iVar3 + dVar4);
  iVar1 = QRect::x(r);
  iVar2 = QRect::width(r);
  iVar3 = QRect::y(r);
  QPainterPath::lineTo(local_38,(double)(iVar1 + iVar2),(double)iVar3);
  iVar1 = QRect::x(r);
  dVar5 = (double)iVar1 + _path;
  iVar1 = QRect::y(r);
  iVar2 = QRect::height(r);
  QPainterPath::lineTo(local_38,dVar5,(double)(iVar1 + iVar2) - dVar4);
  iVar1 = QRect::x(r);
  iVar2 = QRect::y(r);
  QPainterPath::lineTo(local_38,(double)iVar1,(double)iVar2);
  QPainter::setPen((QColor *)p);
  QBrush::QBrush(local_50,(QColor *)color,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_50);
  QPainter::drawPath((QPainterPath *)p);
  QPainterPath::~QPainterPath(local_38);
  return;
}

Assistant:

void drawArrow2( QPainter * p, const QRect & r,
	const QColor & color )
{
	const qreal width = r.height() / 3;
	const qreal middle = r.width() / 2;

	QPainterPath path;
	path.moveTo( r.x(), r.y() );
	path.lineTo( r.x(), r.y() + width );
	path.lineTo( r.x() + middle, r.y() + r.height() );
	path.lineTo( r.x() + r.width(), r.y() + width );
	path.lineTo( r.x() + r.width(), r.y() );
	path.lineTo( r.x() + middle, r.y() + r.height() - width );
	path.lineTo( r.x(), r.y() );

	p->setPen( color );
	p->setBrush( color );
	p->drawPath( path );
}